

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_abs_vec_sparc(TCGContext_conflict7 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  _Bool _Var1;
  TCGType_conflict type_00;
  int iVar2;
  TCGOpcode *n;
  TCGTemp *pTVar3;
  TCGv_vec r_00;
  TCGv_vec t;
  TCGType_conflict type;
  TCGOpcode *hold_list;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict7 *tcg_ctx_local;
  
  tcg_assert_listed_vecop(INDEX_op_abs_vec);
  n = tcg_swap_vecop_list((TCGOpcode *)0x0);
  _Var1 = do_op2(tcg_ctx,vece,r,a,INDEX_op_abs_vec);
  if (!_Var1) {
    pTVar3 = tcgv_vec_temp(tcg_ctx,r);
    type_00 = (TCGType_conflict)((ulong)*(undefined8 *)pTVar3 >> 0x10) & 0xff;
    r_00 = tcg_temp_new_vec_sparc(tcg_ctx,type_00);
    tcg_can_emit_vec_op_sparc(tcg_ctx,INDEX_op_sub_vec,type_00,vece);
    iVar2 = tcg_can_emit_vec_op_sparc(tcg_ctx,INDEX_op_smax_vec,type_00,vece);
    if (iVar2 < 1) {
      iVar2 = tcg_can_emit_vec_op_sparc(tcg_ctx,INDEX_op_sari_vec,type_00,vece);
      if (iVar2 < 1) {
        do_dupi_vec(tcg_ctx,r_00,3,0);
        tcg_gen_cmp_vec_sparc(tcg_ctx,TCG_COND_LT,vece,r_00,a,r_00);
      }
      else {
        tcg_gen_sari_vec_sparc(tcg_ctx,vece,r_00,a,(long)((8 << ((byte)vece & 0x1f)) + -1));
      }
      tcg_gen_xor_vec_sparc(tcg_ctx,vece,r,a,r_00);
      tcg_gen_sub_vec_sparc(tcg_ctx,vece,r,r,r_00);
    }
    else {
      tcg_gen_neg_vec_sparc(tcg_ctx,vece,r_00,a);
      tcg_gen_smax_vec_sparc(tcg_ctx,vece,r,a,r_00);
    }
    tcg_temp_free_vec(tcg_ctx,r_00);
  }
  tcg_swap_vecop_list(n);
  return;
}

Assistant:

void tcg_gen_abs_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list;

    tcg_assert_listed_vecop(INDEX_op_abs_vec);
    hold_list = tcg_swap_vecop_list(NULL);

    if (!do_op2(tcg_ctx, vece, r, a, INDEX_op_abs_vec)) {
        TCGType type = tcgv_vec_temp(tcg_ctx, r)->base_type;
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);

        tcg_debug_assert(tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sub_vec, type, vece));
        if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_smax_vec, type, vece) > 0) {
            tcg_gen_neg_vec(tcg_ctx, vece, t, a);
            tcg_gen_smax_vec(tcg_ctx, vece, r, a, t);
        } else {
            if (tcg_can_emit_vec_op(tcg_ctx, INDEX_op_sari_vec, type, vece) > 0) {
                tcg_gen_sari_vec(tcg_ctx, vece, t, a, (8 << vece) - 1);
            } else {
                do_dupi_vec(tcg_ctx, t, MO_REG, 0);
                tcg_gen_cmp_vec(tcg_ctx, TCG_COND_LT, vece, t, a, t);
            }
            tcg_gen_xor_vec(tcg_ctx, vece, r, a, t);
            tcg_gen_sub_vec(tcg_ctx, vece, r, r, t);
        }

        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}